

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Velocitizer.cpp
# Opt level: O2

void __thiscall OpenMD::Velocitizer::randomizeChargeVelocity(Velocitizer *this,RealType temperature)

{
  SimInfo *info;
  FluctuatingChargeParameters *pFVar1;
  Atom *pAVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ObjectType OVar6;
  FluctuatingChargeConstraints *this_00;
  Molecule *pMVar7;
  pointer ppSVar8;
  Atom *atom;
  ulong uVar9;
  StuntDouble *pSVar10;
  double dVar11;
  result_type_conflict rVar12;
  double dVar13;
  FluctuatingChargeAdapter fqa;
  MoleculeIterator mi;
  FluctuatingChargeAdapter fqa_1;
  _Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> local_98;
  MoleculeIterator local_80;
  FluctuatingChargeConstraints *local_78;
  Molecule *local_70;
  normal_distribution<double> local_68;
  _Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> local_48;
  
  local_80._M_node = (_Base_ptr)0x0;
  local_68._M_param._M_mean = 0.0;
  local_68._M_param._M_stddev = 1.0;
  local_68._M_saved = 0.0;
  local_68._M_saved_available = false;
  info = this->info_;
  pFVar1 = info->simParams_->flucQpars_;
  this_00 = (FluctuatingChargeConstraints *)operator_new(0x88);
  FluctuatingChargeConstraints::FluctuatingChargeConstraints(this_00,info);
  FluctuatingChargeConstraints::setConstrainRegions
            (this_00,(bool)(pFVar1->ConstrainRegions).super_ParameterBase.field_0x2b);
  iVar4 = FluctuatingChargeConstraints::getNumberOfFlucQConstraints(this_00);
  local_78 = this_00;
  iVar5 = FluctuatingChargeConstraints::getNumberOfFlucQAtoms(this_00);
  dVar13 = ((double)iVar5 * 0.0019872156 * temperature) / (double)((iVar5 - iVar4) * 2);
  pMVar7 = SimInfo::beginMolecule(this->info_,&local_80);
  dVar13 = dVar13 + dVar13;
  while (pMVar7 != (Molecule *)0x0) {
    ppSVar8 = (pMVar7->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_70 = pMVar7;
    if (ppSVar8 !=
        (pMVar7->integrableObjects_).
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_001ddb51;
    pSVar10 = (StuntDouble *)0x0;
    while (pSVar10 != (StuntDouble *)0x0) {
      OVar6 = pSVar10->objType_;
      if (OVar6 < otRigidBody) {
        local_98._M_impl.super__Vector_impl_data._M_start = (pointer)pSVar10[1]._vptr_StuntDouble;
        bVar3 = FluctuatingChargeAdapter::isFluctuatingCharge((FluctuatingChargeAdapter *)&local_98)
        ;
        if (bVar3) {
          dVar11 = dVar13 / *(double *)&pSVar10[1].objType_;
          if (dVar11 < 0.0) {
            dVar11 = sqrt(dVar11);
          }
          else {
            dVar11 = SQRT(dVar11);
          }
          rVar12 = std::normal_distribution<double>::operator()
                             (&local_68,
                              (this->randNumGen_).
                              super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr);
          *(double *)
           (*(long *)((long)&(pSVar10->snapshotMan_->currentSnapshot_->atomData).flucQVel.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start + pSVar10->storage_) +
           (long)pSVar10->localIndex_ * 8) = rVar12 * dVar11;
        }
        OVar6 = pSVar10->objType_;
      }
      if (OVar6 == otRigidBody) {
        local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::vector
                  ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)&local_48,
                   (vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)&pSVar10[2].mass_);
        std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::_M_move_assign
                  ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)&local_98,&local_48);
        std::_Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::~_Vector_base(&local_48)
        ;
        for (uVar9 = 0;
            uVar9 < (ulong)((long)local_98._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_98._M_impl.super__Vector_impl_data._M_start >> 3);
            uVar9 = uVar9 + 1) {
          pAVar2 = local_98._M_impl.super__Vector_impl_data._M_start[uVar9];
          local_48._M_impl.super__Vector_impl_data._M_start = (pointer)pAVar2->atomType_;
          bVar3 = FluctuatingChargeAdapter::isFluctuatingCharge
                            ((FluctuatingChargeAdapter *)&local_48);
          if (bVar3) {
            dVar11 = dVar13 / pAVar2->chargeMass_;
            if (dVar11 < 0.0) {
              dVar11 = sqrt(dVar11);
            }
            else {
              dVar11 = SQRT(dVar11);
            }
            rVar12 = std::normal_distribution<double>::operator()
                               (&local_68,
                                (this->randNumGen_).
                                super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr);
            *(double *)
             (*(long *)((long)&(((pAVar2->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                               atomData).flucQVel.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start +
                       (pAVar2->super_StuntDouble).storage_) +
             (long)(pAVar2->super_StuntDouble).localIndex_ * 8) = dVar11 * rVar12;
          }
        }
        std::_Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::~_Vector_base(&local_98)
        ;
      }
      ppSVar8 = ppSVar8 + 1;
      pSVar10 = (StuntDouble *)0x0;
      if (ppSVar8 !=
          (local_70->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_001ddb51:
        pSVar10 = *ppSVar8;
      }
    }
    pMVar7 = SimInfo::nextMolecule(this->info_,&local_80);
  }
  FluctuatingChargeConstraints::applyConstraintsOnChargeVelocities(local_78);
  return;
}

Assistant:

void Velocitizer::randomizeChargeVelocity(RealType temperature) {
    RealType aw2;
    RealType kebar;
    RealType wbar;

    SimInfo::MoleculeIterator mi;
    Molecule::IntegrableObjectIterator ioi;
    Molecule* mol;
    StuntDouble* sd;
    FluctuatingChargeParameters* fqParams;
    FluctuatingChargeConstraints* fqConstraints;

    std::normal_distribution<RealType> normalDistribution {0.0, 1.0};

    Globals* simParams = info_->getSimParams();
    fqParams           = simParams->getFluctuatingChargeParameters();

    fqConstraints = new FluctuatingChargeConstraints(info_);
    fqConstraints->setConstrainRegions(fqParams->getConstrainRegions());

    int nConstrain =
        fqConstraints
            ->getNumberOfFlucQConstraints();  // no of constraints in charge
    int dfRaw = fqConstraints->getNumberOfFlucQAtoms();  // no of FlucQ freedom
    int dfActual = dfRaw - nConstrain;
    kebar        = dfRaw * Constants::kb * temperature / (2 * dfActual);

    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      for (sd = mol->beginIntegrableObject(ioi); sd != NULL;
           sd = mol->nextIntegrableObject(ioi)) {
        if (sd->isAtom()) {
          Atom* atom                   = static_cast<Atom*>(sd);
          AtomType* atomType           = atom->getAtomType();
          FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
          if (fqa.isFluctuatingCharge()) {
            // uses equipartition theory to solve for vbar in angstrom/fs

            aw2  = 2.0 * kebar / atom->getChargeMass();
            wbar = sqrt(aw2);

            // picks random velocities from a gaussian distribution
            // centered on vbar
            atom->setFlucQVel(wbar * normalDistribution(*randNumGen_));
          }
        }

        // randomization of the charge velocities for atoms in the rigidbody

        if (sd->isRigidBody()) {
          RigidBody* rigidbody = static_cast<RigidBody*>(sd);
          vector<Atom*> atomList;
          atomList = rigidbody->getAtoms();

          for (size_t i = 0; i < atomList.size(); ++i) {
            Atom* atom                   = atomList[i];
            AtomType* atomType           = atom->getAtomType();
            FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
            if (fqa.isFluctuatingCharge()) {
              // uses equipartition theory to solve for vbar in angstrom/fs
              aw2  = 2.0 * kebar / atom->getChargeMass();
              wbar = sqrt(aw2);
              // picks random velocities from a gaussian distribution
              // centered on vbar
              atom->setFlucQVel(wbar * normalDistribution(*randNumGen_));
            }
          }
        }
      }
    }
    fqConstraints->applyConstraintsOnChargeVelocities();
  }